

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

Llb_Grp_t * Llb_ManGroupCreate(Llb_Man_t *pMan,Aig_Obj_t *pObj)

{
  uint uVar1;
  Llb_Grp_t *pGroup;
  Vec_Ptr_t *pVVar2;
  
  if ((pObj->field_0x18 & 0x10) == 0) {
    __assert_fail("pObj->fMarkA == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Group.c"
                  ,0xb2,"Llb_Grp_t *Llb_ManGroupCreate(Llb_Man_t *, Aig_Obj_t *)");
  }
  pGroup = Llb_ManGroupAlloc(pMan);
  Vec_PtrPush(pGroup->vOuts,pObj);
  Aig_ManIncrementTravId(pMan->pAig);
  uVar1 = *(uint *)&pObj->field_0x18;
  Llb_ManGroupCreate_rec
            (pMan->pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pGroup->vIns);
  if ((uVar1 & 7) != 3) {
    Llb_ManGroupCreate_rec
              (pMan->pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pGroup->vIns);
  }
  if (pGroup->vNodes == (Vec_Ptr_t *)0x0) {
    pVVar2 = Llb_ManGroupCollect(pGroup);
    pGroup->vNodes = pVVar2;
    return pGroup;
  }
  __assert_fail("p->vNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Group.c"
                ,0xbf,"Llb_Grp_t *Llb_ManGroupCreate(Llb_Man_t *, Aig_Obj_t *)");
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreate( Llb_Man_t * pMan, Aig_Obj_t * pObj )
{
    Llb_Grp_t * p;
    assert( pObj->fMarkA == 1 );
    // derive group
    p = Llb_ManGroupAlloc( pMan );
    Vec_PtrPush( p->vOuts, pObj );
    Aig_ManIncrementTravId( pMan->pAig );
    if ( Aig_ObjIsCo(pObj) )
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin0(pObj), p->vIns );
    else
    {
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin0(pObj), p->vIns );
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin1(pObj), p->vIns );
    }
    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}